

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[117]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [54],
          IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *Args_1,char (*Args_2) [54],
          IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *Args_3,char (*Args_4) [117]
          )

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [117];
  IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *Args_local_3;
  char (*Args_local_2) [54];
  IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *Args_local_1;
  char (*Args_local) [54];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[117]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [54])this,
             (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)Args,
             (char (*) [54])Args_1,
             (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)Args_2,
             (char (*) [117])Args_3);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}